

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void RAW_VLOG(int lvl,char *pat,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_350;
  char local_348 [608];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  va_list ap;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (lvl <= FLAG__namespace_do_not_use_directly_use_DECLARE_int32_t_instead::FLAGS_verbose) {
    ap[0].overflow_arg_area = local_e8;
    ap[0]._0_8_ = &stack0x00000008;
    local_38 = 0x3000000010;
    uStack_350 = (code *)0x11a8fe;
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    vsnprintf(local_348,599,pat,&local_38);
    if (local_348[0] != '\0') {
      uStack_350 = (code *)0x11a90f;
      sVar1 = strlen(local_348);
      if (local_348[sVar1 - 1] != '\n') {
        uStack_350 = (code *)0x11a923;
        sVar1 = strlen(local_348);
        (local_348 + sVar1)[0] = '\n';
        (local_348 + sVar1)[1] = '\0';
      }
    }
    uStack_350 = (code *)0x11a935;
    sVar1 = strlen(local_348);
    uStack_350 = (code *)0x11a94c;
    syscall(1,2,local_348,sVar1);
    if (lvl == -4) {
      uStack_350 = MallocBlock::Deallocate;
      abort();
    }
  }
  return;
}

Assistant:

inline void RAW_VLOG(int lvl, const char* pat, ...) { LOG_PRINTF(lvl, pat); }